

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixedContentModel.hpp
# Opt level: O0

void __thiscall
xercesc_4_0::MixedContentModel::checkUniqueParticleAttribution
          (MixedContentModel *this,SchemaGrammar *param_1,GrammarResolver *param_2,
          XMLStringPool *param_3,XMLValidator *param_4,uint *pContentSpecOrgURI,XMLCh *param_6)

{
  uint uVar1;
  uint local_3c;
  uint orgURIIndex;
  uint i;
  uint *pContentSpecOrgURI_local;
  XMLValidator *param_4_local;
  XMLStringPool *param_3_local;
  GrammarResolver *param_2_local;
  SchemaGrammar *param_1_local;
  MixedContentModel *this_local;
  
  for (local_3c = 0; (ulong)local_3c < this->fCount; local_3c = local_3c + 1) {
    uVar1 = QName::getURI(this->fChildren[local_3c]);
    if (((uVar1 != 0xfffffff1) && (uVar1 != 0xfffffffe)) && (uVar1 != 0xffffffff)) {
      QName::setURI(this->fChildren[local_3c],pContentSpecOrgURI[uVar1]);
    }
  }
  return;
}

Assistant:

inline void MixedContentModel::checkUniqueParticleAttribution
    (
        SchemaGrammar*    const
      , GrammarResolver*  const
      , XMLStringPool*    const
      , XMLValidator*     const
      , unsigned int*     const pContentSpecOrgURI
      , const XMLCh*            /*pComplexTypeName*/ /*= 0*/
    )
{
    // rename back
    unsigned int i = 0;
    for (i = 0; i < fCount; i++) {
        unsigned int orgURIIndex = fChildren[i]->getURI();
        if ((orgURIIndex != XMLContentModel::gEOCFakeId) &&
            (orgURIIndex != XMLElementDecl::fgInvalidElemId) &&
            (orgURIIndex != XMLElementDecl::fgPCDataElemId))
            fChildren[i]->setURI(pContentSpecOrgURI[orgURIIndex]);
    }

    // for mixed content model, it's only a sequence
    // UPA checking is not necessary
}